

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

bool llvm::ARM::getHWDivFeatures
               (uint HWDivKind,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  StringRef local_20;
  
  if (HWDivKind != 0) {
    if ((HWDivKind & 0x20) == 0) {
      local_20.Data = "-hwdiv-arm";
    }
    else {
      local_20.Data = "+hwdiv-arm";
    }
    local_20.Length = 10;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_20);
    if ((HWDivKind & 0x10) == 0) {
      local_20.Data = "-hwdiv";
    }
    else {
      local_20.Data = "+hwdiv";
    }
    local_20.Length = 6;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
              (Features,&local_20);
  }
  return HWDivKind != 0;
}

Assistant:

bool llvm::ARM::getHWDivFeatures(unsigned HWDivKind,
                                 std::vector<StringRef> &Features) {

  if (HWDivKind == ARM::AEK_INVALID)
    return false;

  if (HWDivKind & ARM::AEK_HWDIVARM)
    Features.push_back("+hwdiv-arm");
  else
    Features.push_back("-hwdiv-arm");

  if (HWDivKind & ARM::AEK_HWDIVTHUMB)
    Features.push_back("+hwdiv");
  else
    Features.push_back("-hwdiv");

  return true;
}